

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O0

string * __thiscall
deqp::gls::ShaderExecUtil::ComputeShaderExecutor::generateComputeShader_abi_cxx11_
          (string *__return_storage_ptr__,ComputeShaderExecutor *this,ShaderSpec *spec)

{
  char *pcVar1;
  ostream *poVar2;
  ulong uVar3;
  ostringstream local_190 [8];
  ostringstream src;
  ShaderSpec *spec_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  pcVar1 = glu::getGLSLVersionDeclaration
                     (*(GLSLVersion *)
                       &(this->super_BufferIoExecutor).super_ShaderExecutor._vptr_ShaderExecutor);
  poVar2 = std::operator<<((ostream *)local_190,pcVar1);
  std::operator<<(poVar2,"\n");
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    poVar2 = std::operator<<((ostream *)local_190,
                             (string *)
                             &(this->super_BufferIoExecutor).super_ShaderExecutor.m_outputs.
                              super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::operator<<(poVar2,"\n");
  }
  poVar2 = std::operator<<((ostream *)local_190,"layout(local_size_x = 1) in;\n");
  std::operator<<(poVar2,"\n");
  BufferIoExecutor::declareBufferBlocks((ostream *)local_190,(ShaderSpec *)this);
  poVar2 = std::operator<<((ostream *)local_190,"void main (void)\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(poVar2,
                           "\tuint invocationNdx = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z\n"
                          );
  std::operator<<(poVar2,
                  "\t                   + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n"
                 );
  BufferIoExecutor::generateExecBufferIo((ostream *)local_190,(ShaderSpec *)this,"invocationNdx");
  std::operator<<((ostream *)local_190,"}\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string ComputeShaderExecutor::generateComputeShader (const ShaderSpec& spec)
{
	std::ostringstream src;

	src << glu::getGLSLVersionDeclaration(spec.version) << "\n";

	if (!spec.globalDeclarations.empty())
		src << spec.globalDeclarations << "\n";

	src << "layout(local_size_x = 1) in;\n"
		<< "\n";

	declareBufferBlocks(src, spec);

	src << "void main (void)\n"
		<< "{\n"
		<< "	uint invocationNdx = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z\n"
		<< "	                   + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n";

	generateExecBufferIo(src, spec, "invocationNdx");

	src << "}\n";

	return src.str();
}